

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O2

size_t shell_quotearg(char *path,uchar *buf,size_t bufsize)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar uVar3;
  uchar *puVar4;
  int iVar5;
  
  puVar1 = buf + bufsize;
  iVar5 = 0;
  puVar4 = buf;
  while ((uVar3 = *path, uVar3 != '\0' && (puVar4 < buf + (bufsize - 1)))) {
    if (uVar3 == '!') {
      if (iVar5 == 2) {
        if (puVar1 <= puVar4 + 2) {
          return 0;
        }
        puVar4[0] = '\"';
        puVar4[1] = '\\';
        puVar4 = puVar4 + 2;
      }
      else if (iVar5 == 1) {
        if (puVar1 <= puVar4 + 2) {
          return 0;
        }
        puVar4[0] = '\'';
        puVar4[1] = '\\';
        puVar4 = puVar4 + 2;
      }
      else {
        if (puVar1 <= puVar4 + 1) {
          return 0;
        }
        *puVar4 = '\\';
        puVar4 = puVar4 + 1;
      }
      iVar5 = 0;
    }
    else if (uVar3 == '\'') {
      if (iVar5 == 1) {
        if (puVar1 <= puVar4 + 2) {
          return 0;
        }
        puVar4[0] = '\'';
        puVar4[1] = '\"';
        puVar4 = puVar4 + 2;
      }
      else if (iVar5 == 0) {
        if (puVar1 <= puVar4 + 1) {
          return 0;
        }
        *puVar4 = '\"';
        puVar4 = puVar4 + 1;
      }
      iVar5 = 2;
    }
    else {
      if (iVar5 == 2) {
        if (puVar1 <= puVar4 + 2) {
          return 0;
        }
        puVar4[0] = '\"';
        puVar4[1] = '\'';
        puVar4 = puVar4 + 2;
      }
      else if (iVar5 == 0) {
        if (puVar1 <= puVar4 + 1) {
          return 0;
        }
        *puVar4 = '\'';
        puVar4 = puVar4 + 1;
      }
      iVar5 = 1;
    }
    if (puVar1 <= puVar4 + 1) {
      return 0;
    }
    uVar3 = *path;
    path = (char *)((uchar *)path + 1);
    *puVar4 = uVar3;
    puVar4 = puVar4 + 1;
  }
  if (iVar5 == 1) {
    uVar3 = '\'';
  }
  else {
    puVar2 = puVar4;
    if (iVar5 != 2) goto LAB_00120863;
    uVar3 = '\"';
  }
  puVar2 = puVar4 + 1;
  if (puVar1 <= puVar2) {
    return 0;
  }
  *puVar4 = uVar3;
LAB_00120863:
  if (puVar1 <= puVar2 + 1) {
    return 0;
  }
  *puVar2 = '\0';
  return (long)puVar2 - (long)buf;
}

Assistant:

static size_t
shell_quotearg(const char *path, unsigned char *buf,
               size_t bufsize)
{
    const char *src;
    unsigned char *dst, *endp;

    /*
     * Processing States:
     *  UQSTRING:       unquoted string: ... -- used for quoting exclamation
     *                  marks. This is the initial state
     *  SQSTRING:       single-quoted-string: '... -- any character may follow
     *  QSTRING:        quoted string: "... -- only apostrophes may follow
     */
    enum { UQSTRING, SQSTRING, QSTRING } state = UQSTRING;

    endp = &buf[bufsize];
    src = path;
    dst = buf;
    while(*src && dst < endp - 1) {

        switch(*src) {
            /*
             * Special handling for apostrophe.
             * An apostrophe is always written in quotation marks, e.g.
             * ' -> "'".
             */

        case '\'':
            switch(state) {
            case UQSTRING:      /* Unquoted string */
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '"';
                break;
            case QSTRING:       /* Continue quoted string */
                break;
            case SQSTRING:      /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '"';
                break;
            default:
                break;
            }
            state = QSTRING;
            break;

            /*
             * Special handling for exclamation marks. CSH interprets
             * exclamation marks even when quoted with apostrophes. We convert
             * it to the plain string \!, because both Bourne Shell and CSH
             * interpret that as a verbatim exclamation mark.
             */

        case '!':
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\\';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\\';
                break;
            case SQSTRING:              /* Close single quoted string */
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '\'';
                *dst++ = '\\';
                break;
            default:
                break;
            }
            state = UQSTRING;
            break;

            /*
             * Ordinary character: prefer single-quoted string
             */

        default:
            switch(state) {
            case UQSTRING:
                if(dst + 1 >= endp)
                    return 0;
                *dst++ = '\'';
                break;
            case QSTRING:
                if(dst + 2 >= endp)
                    return 0;
                *dst++ = '"';           /* Closing quotation mark */
                *dst++ = '\'';
                break;
            case SQSTRING:      /* Continue single quoted string */
                break;
            default:
                break;
            }
            state = SQSTRING;   /* Start single-quoted string */
            break;
        }

        if(dst + 1 >= endp)
            return 0;
        *dst++ = *src++;
    }

    switch(state) {
    case UQSTRING:
        break;
    case QSTRING:           /* Close quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '"';
        break;
    case SQSTRING:          /* Close single quoted string */
        if(dst + 1 >= endp)
            return 0;
        *dst++ = '\'';
        break;
    default:
        break;
    }

    if(dst + 1 >= endp)
        return 0;
    *dst = '\0';

    /* The result cannot be larger than 3 * strlen(path) + 2 */
    /* assert((dst - buf) <= (3 * (src - path) + 2)); */

    return dst - buf;
}